

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O0

int run(int validate_utf8)

{
  yajl_status yVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  yajl_handle h;
  size_t sVar5;
  uchar *puVar6;
  int in_EDI;
  double dVar7;
  double dVar8;
  int avg_doc_size;
  int i_1;
  char **units;
  char *all_units [4];
  double now_1;
  double throughput;
  uchar *str;
  char **d;
  yajl_status stat;
  yajl_handle hand;
  double now;
  int i;
  double starttime;
  longlong times;
  uchar *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uchar *in_stack_ffffffffffffff48;
  yajl_handle in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  yajl_handle in_stack_ffffffffffffff60;
  yajl_callbacks *in_stack_ffffffffffffff68;
  int local_88;
  int local_84;
  char **local_80;
  char *local_78;
  char *local_70;
  double local_50;
  char **local_40;
  int local_1c;
  long local_10;
  
  local_10 = 0;
  dVar7 = mygettime();
  do {
    dVar8 = mygettime();
    if (3.0 <= dVar8 - dVar7) {
      local_78 = "B/s";
      local_70 = "KB/s";
      local_80 = &local_78;
      local_88 = 0;
      dVar8 = mygettime();
      local_84 = 0;
      while (iVar4 = local_84, iVar2 = num_docs(), iVar4 < iVar2) {
        uVar3 = doc_size(iVar4);
        local_88 = uVar3 + local_88;
        local_84 = local_84 + 1;
      }
      iVar4 = num_docs();
      local_50 = (double)(local_10 * (local_88 / iVar4)) / (dVar8 - dVar7);
      for (; local_80[1] != (char *)0x0 && 1024.0 < local_50; local_80 = local_80 + 1) {
        local_50 = local_50 / 1024.0;
      }
      printf("Parsing speed: %g %s\n",local_50,*local_80,(long)local_88 % (long)iVar4 & 0xffffffff);
      return 0;
    }
    for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
      h = yajl_alloc(in_stack_ffffffffffffff68,(yajl_alloc_funcs *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
      yajl_config(h,yajl_dont_validate_strings,(ulong)(in_EDI == 0));
      iVar4 = num_docs();
      for (local_40 = get_doc((int)(local_10 % (long)iVar4)); *local_40 != (char *)0x0;
          local_40 = local_40 + 1) {
        in_stack_ffffffffffffff68 = (yajl_callbacks *)*local_40;
        in_stack_ffffffffffffff60 = h;
        strlen(*local_40);
        yVar1 = yajl_parse(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (yVar1 != yajl_status_ok) break;
      }
      yVar1 = yajl_complete_parse((yajl_handle)0x1023e8);
      if (yVar1 != yajl_status_ok) {
        if (*local_40 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          sVar5 = strlen(*local_40);
          iVar4 = (int)(sVar5 >> 0x20);
        }
        puVar6 = yajl_get_error(h,iVar4,(uchar *)CONCAT44(in_stack_ffffffffffffff44,
                                                          in_stack_ffffffffffffff40),
                                (size_t)in_stack_ffffffffffffff38);
        fprintf(_stderr,"%s",puVar6);
        yajl_free_error((yajl_handle)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
        return 1;
      }
      yajl_free((yajl_handle)0x1024bb);
      local_10 = local_10 + 1;
    }
  } while( true );
}

Assistant:

static int
run(int validate_utf8)
{
    long long times = 0; 
    double starttime;

    starttime = mygettime();

    /* allocate a parser */
    for (;;) {
		int i;
        {
            double now = mygettime();
            if (now - starttime >= PARSE_TIME_SECS) break;
        }

        for (i = 0; i < 100; i++) {
            yajl_handle hand = yajl_alloc(NULL, NULL, NULL);
            yajl_status stat;        
            const char ** d;

            yajl_config(hand, yajl_dont_validate_strings, validate_utf8 ? 0 : 1);

            for (d = get_doc(times % num_docs()); *d; d++) {
                stat = yajl_parse(hand, (unsigned char *) *d, strlen(*d));
                if (stat != yajl_status_ok) break;
            }
            
            stat = yajl_complete_parse(hand);

            if (stat != yajl_status_ok) {
                unsigned char * str =
                    yajl_get_error(hand, 1,
                                   (unsigned char *) *d,
                                   (*d ? strlen(*d) : 0));
                fprintf(stderr, "%s", (const char *) str);
                yajl_free_error(hand, str);
                return 1;
            }
            yajl_free(hand);
            times++;
        }
    }

    /* parsed doc 'times' times */
    {
        double throughput;
        double now;
        const char * all_units[] = { "B/s", "KB/s", "MB/s", (char *) 0 };
        const char ** units = all_units;
        int i, avg_doc_size = 0;

        now = mygettime();

        for (i = 0; i < num_docs(); i++) avg_doc_size += doc_size(i);
        avg_doc_size /= num_docs();

        throughput = (times * avg_doc_size) / (now - starttime);
        
        while (*(units + 1) && throughput > 1024) {
            throughput /= 1024;
            units++;
        }
        
        printf("Parsing speed: %g %s\n", throughput, *units);
    }

    return 0;
}